

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  uint uVar6;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [5];
  int fd;
  long local_38;
  char local_2c [8];
  int local_24;
  
  iVar1 = uv_fileno(handle,&local_24);
  local_38 = (long)iVar1;
  if (local_38 != 0) goto LAB_001b575e;
  local_2c[0] = '\0';
  local_2c[1] = '\0';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  local_2c[4] = 0;
  if ((events & 8U) != 0) {
    do {
      sVar3 = recv(client_fd,local_2c,5,1);
      if ((int)sVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((-1 < (int)sVar3) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
      cli_pr_check = 1;
      iVar1 = uv_poll_stop(poll_req);
      local_38 = (long)iVar1;
      if (local_38 != 0) goto LAB_001b576d;
      iVar1 = uv_poll_start(poll_req,3,poll_cb);
      local_38 = (long)iVar1;
      if (local_38 == 0) goto LAB_001b5459;
      goto LAB_001b577c;
    }
    goto LAB_001b57b8;
  }
LAB_001b5459:
  if ((events & 1U) == 0) {
LAB_001b56e4:
    if ((events & 2U) == 0) {
      return;
    }
    do {
      sVar3 = send(client_fd,"foo",3,0);
      if (-1 < (int)sVar3) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    local_38 = 3;
    if ((int)sVar3 == 3) {
      return;
    }
    goto LAB_001b578b;
  }
  if (local_24 != client_fd) {
LAB_001b562f:
    if (local_24 != server_fd) goto LAB_001b56e4;
    do {
      plVar5 = (long *)(ulong)(uint)server_fd;
      sVar3 = recv(server_fd,local_2c,3,0);
      iVar1 = (int)sVar3;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_001b57fe;
    local_38 = 3;
    if (iVar1 != 3) goto LAB_001b579a;
    iVar1 = strncmp(local_2c,"foo",3);
    local_38 = (long)iVar1;
    if (local_38 == 0) {
      srv_rd_check = 1;
      uv_poll_stop(0x371160);
      goto LAB_001b56e4;
    }
    goto LAB_001b57a9;
  }
  do {
    sVar3 = recv(client_fd,local_2c,5,0);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_001b57db;
  if (cli_rd_check == 1) {
    iVar2 = strncmp(local_2c,"world",(long)iVar1);
    local_38 = (long)iVar2;
    if (local_38 != 0) goto LAB_001b57bd;
    local_38 = 5;
    if ((long)iVar1 == 5) {
      cli_rd_check = 2;
      goto LAB_001b551a;
    }
    goto LAB_001b57cc;
  }
LAB_001b551a:
  if (cli_rd_check != 0) goto LAB_001b562f;
  local_38 = 4;
  if (iVar1 != 4) goto LAB_001b57e0;
  iVar1 = strncmp(local_2c,"hello",4);
  local_38 = (long)iVar1;
  if (local_38 == 0) {
    cli_rd_check = 1;
LAB_001b5590:
    plVar5 = (long *)(ulong)(uint)server_fd;
    sVar3 = recv(server_fd,local_2c,5,0);
    uVar6 = (uint)sVar3;
    if (uVar6 == 0xffffffff) goto code_r0x001b55ae;
    goto LAB_001b55b8;
  }
  goto LAB_001b57ef;
code_r0x001b55ae:
  piVar4 = __errno_location();
  if (*piVar4 == 4) goto LAB_001b5590;
LAB_001b55b8:
  if ((int)uVar6 < 1) {
    piVar4 = __errno_location();
    if ((*piVar4 == 0xb) || (*piVar4 == 0x73)) goto LAB_001b562f;
    goto LAB_001b5803;
  }
  local_38 = 5;
  if ((uVar6 & 0x7fffffff) == 5) {
    iVar1 = strncmp(local_2c,"world",5);
    local_38 = (long)iVar1;
    if (local_38 != 0) goto LAB_001b574f;
    cli_rd_check = 2;
    goto LAB_001b5590;
  }
  poll_cb_cold_14();
LAB_001b574f:
  poll_cb_cold_15();
LAB_001b575e:
  poll_cb_cold_1();
LAB_001b576d:
  poll_cb_cold_3();
LAB_001b577c:
  poll_cb_cold_4();
LAB_001b578b:
  poll_cb_cold_16();
LAB_001b579a:
  poll_cb_cold_11();
LAB_001b57a9:
  poll_cb_cold_12();
LAB_001b57b8:
  poll_cb_cold_2();
LAB_001b57bd:
  poll_cb_cold_6();
LAB_001b57cc:
  poll_cb_cold_7();
LAB_001b57db:
  poll_cb_cold_5();
LAB_001b57e0:
  poll_cb_cold_8();
LAB_001b57ef:
  plVar5 = &local_38;
  poll_cb_cold_9();
LAB_001b57fe:
  poll_cb_cold_10();
LAB_001b5803:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(0x371160);
  uv_close(&server_handle,0);
  uv_close(&client_handle,0);
  uv_close(&peer_handle,0);
  uv_close(plVar5,0);
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT_OK(uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT_OK(uv_poll_stop(&poll_req[0]));
    ASSERT_OK(uv_poll_start(&poll_req[0],
                            UV_READABLE | UV_WRITABLE,
                            poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT_OK(strncmp(buffer, "world", n));
        ASSERT_EQ(5, n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT_EQ(4, n);
        ASSERT_OK(strncmp(buffer, "hello", n));
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT_EQ(5, n);
            ASSERT_OK(strncmp(buffer, "world", n));
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT_EQ(3, n);
      ASSERT_OK(strncmp(buffer, "foo", n));
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT_EQ(3, n);
  }
}